

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

void helper_daa_x86_64(CPUX86State *env)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  byte bVar4;
  uint uVar5;
  
  uVar3 = cpu_cc_compute_all_x86_64(env,env->cc_op);
  uVar1 = (uint)env->regs[0];
  uVar5 = uVar1 & 0xff;
  bVar4 = (byte)((uVar3 & 0x10) >> 4) | 9 < (uVar1 & 0xe);
  uVar1 = uVar1 + 6 & 0xff;
  if (bVar4 == 0) {
    uVar1 = uVar5;
  }
  uVar2 = uVar1 + 0x60 & 0xff;
  if ((uVar3 & 1) == 0 && 0x99 >= uVar5) {
    uVar2 = uVar1;
  }
  *(char *)env->regs = (char)uVar2;
  env->cc_src = (ulong)((byte)((byte)uVar3 | 0x99 < uVar5) & 1 | (uint)bVar4 << 4 |
                        uVar2 & 0xffffff80 | (uint)(uVar2 == 0) << 6 | (uint)"\x04"[uVar2]);
  return;
}

Assistant:

void helper_daa(CPUX86State *env)
{
    int old_al, al, af, cf;
    int eflags;

    eflags = cpu_cc_compute_all(env, CC_OP);
    cf = eflags & CC_C;
    af = eflags & CC_A;
    old_al = al = env->regs[R_EAX] & 0xff;

    eflags = 0;
    if (((al & 0x0f) > 9) || af) {
        al = (al + 6) & 0xff;
        eflags |= CC_A;
    }
    if ((old_al > 0x99) || cf) {
        al = (al + 0x60) & 0xff;
        eflags |= CC_C;
    }
    env->regs[R_EAX] = (env->regs[R_EAX] & ~0xff) | al;
    /* well, speed is not an issue here, so we compute the flags by hand */
    eflags |= (al == 0) << 6; /* zf */
    eflags |= parity_table[al]; /* pf */
    eflags |= (al & 0x80); /* sf */
    CC_SRC = eflags;
}